

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

void Wlc_NtkSaveOneNode(Wlc_Ntk_t *p,Wlc_Obj_t *pWlcObj,Gia_Man_t *pGia,Vec_Mem_t *vTtMem)

{
  ulong uVar1;
  int nWords_00;
  int iVar2;
  int iVar3;
  int Lit;
  int iObj;
  uint uVar4;
  uint uVar5;
  word *pOut;
  int fCompl;
  word *pInfoObj;
  int iLit;
  int iFirst;
  int nBits;
  int nWords;
  int Entry;
  int k;
  Vec_Mem_t *vTtMem_local;
  Gia_Man_t *pGia_local;
  Wlc_Obj_t *pWlcObj_local;
  Wlc_Ntk_t *p_local;
  
  nWords_00 = Vec_MemEntrySize(vTtMem);
  iVar2 = Wlc_ObjRange(pWlcObj);
  iVar3 = Wlc_ObjId(p,pWlcObj);
  iVar3 = Vec_IntEntry(&p->vCopies,iVar3);
  for (nWords = 0; nWords < iVar2; nWords = nWords + 1) {
    Lit = Vec_IntEntry(&p->vBits,iVar3 + nWords);
    iObj = Abc_Lit2Var(Lit);
    pOut = Wlc_ObjSim(pGia,iObj);
    uVar1 = *pOut;
    if ((uVar1 & 1) != 0) {
      Abc_TtNot(pOut,nWords_00);
    }
    uVar4 = Vec_MemHashInsert(vTtMem,pOut);
    if ((uVar1 & 1) != 0) {
      Abc_TtNot(pOut,nWords_00);
    }
    uVar5 = Abc_LitIsCompl(Lit);
    printf("%2d(%d) ",(ulong)uVar4,(ulong)((uint)uVar1 & 1 ^ uVar5));
    Extra_PrintHex(_stdout,(uint *)pOut,8);
    printf("\n");
  }
  printf("\n");
  return;
}

Assistant:

void Wlc_NtkSaveOneNode( Wlc_Ntk_t * p, Wlc_Obj_t * pWlcObj, Gia_Man_t * pGia, Vec_Mem_t * vTtMem )
{
    int k, Entry;
    int nWords = Vec_MemEntrySize(vTtMem);
    int nBits = Wlc_ObjRange(pWlcObj);
    int iFirst = Vec_IntEntry( &p->vCopies, Wlc_ObjId(p, pWlcObj) );
    for ( k = 0; k < nBits; k++ )
    {
        int iLit = Vec_IntEntry( &p->vBits, iFirst + k );
        word * pInfoObj = Wlc_ObjSim( pGia, Abc_Lit2Var(iLit) );
        int fCompl = pInfoObj[0] & 1;
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        Entry = Vec_MemHashInsert( vTtMem, pInfoObj );
        if ( fCompl ) Abc_TtNot( pInfoObj, nWords );
        printf( "%2d(%d) ", Entry, fCompl ^ Abc_LitIsCompl(iLit) );
        Extra_PrintHex( stdout, (unsigned*)pInfoObj, 8 );
        printf( "\n" );
    }
    printf( "\n" );
}